

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seed_rng.hpp
# Opt level: O0

void __thiscall boost::uuids::detail::seed_rng::sha1_random_digest_(seed_rng *this)

{
  size_t sVar1;
  seed_rng *in_RDI;
  int i;
  uint digest [5];
  seed_rng *this_ptr;
  uint *p;
  uint rn [3];
  clock_t ck;
  uint *ps;
  timeval ts;
  pid_t pid;
  uchar state [20];
  sha1 sha;
  digest_type *in_stack_fffffffffffffee8;
  size_t in_stack_fffffffffffffef0;
  sha1 *this_00;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int iVar2;
  uint local_f8 [8];
  sha1 *local_d8;
  int local_cc;
  int local_c8;
  int local_c4;
  clock_t local_c0;
  uint *local_b8;
  timeval local_b0;
  __pid_t local_9c;
  undefined1 local_98 [152];
  
  sha1::sha1((sha1 *)0x1292b9);
  if (in_RDI->random_ != (FILE *)0x0) {
    sVar1 = fread(local_98,1,0x14,(FILE *)in_RDI->random_);
    ignore_size(in_RDI,sVar1);
    sha1::process_bytes((sha1 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),in_RDI
                        ,in_stack_fffffffffffffef0);
  }
  local_9c = getpid();
  sha1::process_bytes((sha1 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),in_RDI,
                      in_stack_fffffffffffffef0);
  gettimeofday(&local_b0,(__timezone_ptr_t)0x0);
  sha1::process_bytes((sha1 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),in_RDI,
                      in_stack_fffffffffffffef0);
  local_b8 = sha1_random_digest_state_();
  sha1::process_bytes((sha1 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),in_RDI,
                      in_stack_fffffffffffffef0);
  sha1::process_bytes((sha1 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),in_RDI,
                      in_stack_fffffffffffffef0);
  local_c0 = clock();
  sha1::process_bytes((sha1 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),in_RDI,
                      in_stack_fffffffffffffef0);
  local_cc = rand();
  local_c8 = rand();
  local_c4 = rand();
  sha1::process_bytes((sha1 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),in_RDI,
                      in_stack_fffffffffffffef0);
  local_d8 = (sha1 *)operator_new(4);
  sha1::process_bytes((sha1 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),in_RDI,
                      in_stack_fffffffffffffef0);
  this_00 = local_d8;
  if (local_d8 != (sha1 *)0x0) {
    operator_delete(local_d8,4);
  }
  sha1::process_bytes((sha1 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),in_RDI,
                      (size_t)this_00);
  sha1::process_bytes((sha1 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),in_RDI,
                      (size_t)this_00);
  sha1::get_digest(this_00,in_stack_fffffffffffffee8);
  for (iVar2 = 0; iVar2 < 5; iVar2 = iVar2 + 1) {
    local_b8[iVar2] = local_f8[iVar2] ^ local_b8[iVar2];
    in_RDI->rd_[iVar2] = local_f8[iVar2] ^ in_RDI->rd_[iVar2];
  }
  return;
}

Assistant:

void sha1_random_digest_()
    {
        boost::uuids::detail::sha1 sha;


        if (random_)
        {
            // intentionally left uninitialized
            unsigned char state[ 20 ];
#if defined(BOOST_WINDOWS)
            boost::winapi::CryptGenRandom(random_, sizeof(state), state);
#else
            ignore_size(std::fread( state, 1, sizeof(state), random_ ));
#endif
            sha.process_bytes( state, sizeof( state ) );
        }

        {
            // Getting enropy from some system specific sources
#if defined(BOOST_WINDOWS)
            boost::winapi::DWORD_ procid = boost::winapi::GetCurrentProcessId();
            sha.process_bytes( (unsigned char const*)&procid, sizeof( procid ) );

            boost::winapi::DWORD_ threadid = boost::winapi::GetCurrentThreadId();
            sha.process_bytes( (unsigned char const*)&threadid, sizeof( threadid ) );

            boost::winapi::LARGE_INTEGER_ ts;
            ts.QuadPart = 0;
            boost::winapi::QueryPerformanceCounter( &ts );
            sha.process_bytes( (unsigned char const*)&ts, sizeof( ts ) );

            std::time_t tm = std::time( 0 );
            sha.process_bytes( (unsigned char const*)&tm, sizeof( tm ) );
#else
            pid_t pid = getpid();
            sha.process_bytes( (unsigned char const*)&pid, sizeof( pid ) );

            timeval ts;
            gettimeofday(&ts, NULL); // We do not use `clock_gettime` to avoid linkage with -lrt
            sha.process_bytes( (unsigned char const*)&ts, sizeof( ts ) );
#endif
        }


        unsigned int * ps = sha1_random_digest_state_();
        sha.process_bytes( ps, internal_state_size * sizeof( unsigned int ) );
        sha.process_bytes( (unsigned char const*)&ps, sizeof( ps ) );

        {
            std::clock_t ck = std::clock();
            sha.process_bytes( (unsigned char const*)&ck, sizeof( ck ) );
        }

        {
            unsigned int rn[] =
                { static_cast<unsigned int>(std::rand())
                , static_cast<unsigned int>(std::rand())
                , static_cast<unsigned int>(std::rand())
                };
            sha.process_bytes( (unsigned char const*)rn, sizeof( rn ) );
        }

        {
            unsigned int * p = new unsigned int;
            sha.process_bytes( (unsigned char const*)&p, sizeof( p ) );
            delete p;

            const seed_rng* this_ptr = this;
            sha.process_bytes( (unsigned char const*)&this_ptr, sizeof( this_ptr ) );
        }

        sha.process_bytes( (unsigned char const*)rd_, sizeof( rd_ ) );

        unsigned int digest[ 5 ];
        sha.get_digest( digest );

        for( int i = 0; i < 5; ++i )
        {
            // harmless data race
            ps[ i ] ^= digest[ i ];
            rd_[ i ] ^= digest[ i ];
        }
    }